

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_bv_base.h
# Opt level: O3

int64 __thiscall sc_dt::sc_proxy<sc_dt::sc_bv_base>::to_int64(sc_proxy<sc_dt::sc_bv_base> *this)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  sc_bv_base *x;
  
  uVar1 = *(uint *)&this[1]._vptr_sc_proxy;
  pp_Var2 = this[2]._vptr_sc_proxy;
  if ((int)uVar1 < 0x21) {
    p_Var3 = (_func_int *)(ulong)*(uint *)pp_Var2;
  }
  else {
    p_Var3 = *pp_Var2;
    if (0x3f < uVar1) {
      return (int64)p_Var3;
    }
  }
  uVar5 = uVar1 - 1;
  uVar6 = uVar1 + 0x1e;
  if (-1 < (int)uVar5) {
    uVar6 = uVar5;
  }
  if ((*(uint *)((long)pp_Var2 + (long)((int)uVar6 >> 5) * 4) >> (uVar5 & 0x1f) & 1) != 0) {
    return (ulong)p_Var3 | -1L << ((byte)uVar1 & 0x3f);
  }
  bVar4 = -(byte)uVar1;
  return (ulong)((long)p_Var3 << (bVar4 & 0x3f)) >> (bVar4 & 0x3f);
}

Assistant:

int length() const
	{ return m_len; }